

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

CFG * __thiscall spirv_cross::Compiler::get_cfg_for_function(Compiler *this,uint32_t id)

{
  const_iterator cVar1;
  key_type local_4;
  
  cVar1 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->function_cfgs)._M_h,&local_4);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    __assert_fail("cfg_itr != end(function_cfgs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross.cpp"
                  ,0xfbb,"const CFG &spirv_cross::Compiler::get_cfg_for_function(uint32_t) const");
  }
  if (*(CFG **)((long)cVar1.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
                      ._M_cur + 0x10) != (CFG *)0x0) {
    return *(CFG **)((long)cVar1.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
                           ._M_cur + 0x10);
  }
  __assert_fail("cfg_itr->second",
                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross.cpp"
                ,0xfbc,"const CFG &spirv_cross::Compiler::get_cfg_for_function(uint32_t) const");
}

Assistant:

const CFG &Compiler::get_cfg_for_function(uint32_t id) const
{
	auto cfg_itr = function_cfgs.find(id);
	assert(cfg_itr != end(function_cfgs));
	assert(cfg_itr->second);
	return *cfg_itr->second;
}